

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

Graph<int> * __thiscall hdc::Graph<int>::to_str_abi_cxx11_(Graph<int> *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  reference piVar4;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_RSI;
  _Self local_1e0;
  _Base_ptr local_1d8;
  _Self local_1d0;
  _Base_ptr local_1c8;
  _Rb_tree_const_iterator<int> local_1b0;
  iterator it2;
  iterator it1;
  stringstream ss;
  ostream local_190 [384];
  Graph<int> *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&it1);
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *)&it2);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_1b0);
  std::operator<<(local_190,"{\n");
  local_1c8 = (_Base_ptr)
              std::
              map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::begin(in_RSI);
  it2._M_node = local_1c8;
  while( true ) {
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end(in_RSI);
    bVar1 = std::operator!=((_Self *)&it2,&local_1d0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"    ");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)&it2);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->first);
    std::operator<<(poVar2," -> {");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)&it2);
    local_1d8 = (_Base_ptr)
                std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&ppVar3->second);
    local_1b0._M_node = local_1d8;
    while( true ) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             *)&it2);
      local_1e0._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&ppVar3->second);
      bVar1 = std::operator!=(&local_1b0,&local_1e0);
      if (!bVar1) break;
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&local_1b0);
      poVar2 = (ostream *)std::ostream::operator<<(local_190,*piVar4);
      std::operator<<(poVar2,", ");
      std::_Rb_tree_const_iterator<int>::operator++(&local_1b0);
    }
    std::operator<<(local_190,"}\n");
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)&it2);
  }
  std::operator<<(local_190,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&it1);
  return this;
}

Assistant:

std::string to_str() {
            std::stringstream ss;
            typename std::map<T, std::set<T> >::iterator it1;
            typename std::set<T>::iterator it2;

            ss << "{\n";

            for (it1 = graph.begin(); it1 != graph.end(); ++it1) {
                 ss << "    " << it1->first << " -> {";

                 for (it2 = it1->second.begin(); it2 != it1->second.end(); ++it2) {
                     ss << *it2 << ", ";
                 }

                 ss << "}\n";
            }

            ss << "}\n";

            return ss.str();
        }